

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseCommentComplex(xmlParserCtxtPtr ctxt,xmlChar *buf,size_t len,size_t size)

{
  xmlParserInputPtr pxVar1;
  commentSAXFunc p_Var2;
  size_t sVar3;
  uint val;
  uint uVar4;
  uint uVar5;
  int iVar6;
  xmlChar *val_00;
  char *msg;
  uint val_01;
  ulong uVar7;
  int l;
  int rl;
  int ql;
  int local_64;
  int local_60;
  int local_5c;
  size_t local_58;
  ulong local_50;
  ulong local_48;
  int local_40;
  uint local_3c;
  ulong local_38;
  
  local_38 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    local_38 = 10000000;
  }
  iVar6 = ctxt->input->id;
  if (buf == (xmlChar *)0x0) {
    size = 100;
    buf = (xmlChar *)(*xmlMallocAtomic)(100);
    if (buf == (xmlChar *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return;
    }
    len = 0;
  }
  local_58 = len;
  local_40 = iVar6;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  val = xmlCurrentChar(ctxt,&local_5c);
  if (val == 0) {
LAB_0015b4b0:
    msg = "Comment not terminated\n";
    val_00 = (xmlChar *)0x0;
LAB_0015b4c1:
    xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,msg,val_00);
  }
  else {
    if ((int)val < 0x100) {
      if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
      goto LAB_0015b122;
    }
    else if (val - 0x10000 < 0x100000 || (val - 0xe000 < 0x1ffe || val < 0xd800)) {
LAB_0015b122:
      pxVar1 = ctxt->input;
      if (*pxVar1->cur == '\n') {
        pxVar1->line = pxVar1->line + 1;
        pxVar1->col = 1;
      }
      else {
        pxVar1->col = pxVar1->col + 1;
      }
      pxVar1->cur = pxVar1->cur + local_5c;
      uVar4 = xmlCurrentChar(ctxt,&local_60);
      if (uVar4 == 0) goto LAB_0015b4b0;
      if ((int)uVar4 < 0x100) {
        if ((0x1f < (int)uVar4) || ((uVar4 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0)))) {
LAB_0015b180:
          pxVar1 = ctxt->input;
          if (*pxVar1->cur == '\n') {
            pxVar1->line = pxVar1->line + 1;
            pxVar1->col = 1;
          }
          else {
            pxVar1->col = pxVar1->col + 1;
          }
          pxVar1->cur = pxVar1->cur + local_60;
          uVar5 = xmlCurrentChar(ctxt,&local_64);
          if (uVar5 != 0) {
            local_48 = 0;
            val_00 = buf;
            val_01 = val;
            val = uVar5;
            local_50 = size;
            do {
              uVar7 = local_50;
              sVar3 = local_58;
              buf = val_00;
              if ((int)val < 0x100) {
                if ((int)val < 0x20) {
                  if ((0xd < val) || ((0x2600U >> (val & 0x1f) & 1) == 0)) {
                    val_00[local_58] = '\0';
                    if (val != 0) goto LAB_0015b1f2;
                    msg = "Comment not terminated \n<!--%.50s\n";
                    goto LAB_0015b4c1;
                  }
                }
                else if (val_01 == 0x2d && (uVar4 == 0x2d && val == 0x3e)) {
                  val_00[local_58] = '\0';
                  if (local_40 != ctxt->input->id) {
                    xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                                   "Comment doesn\'t start and stop in the same entity\n");
                  }
                  xmlNextChar(ctxt);
                  if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                      (p_Var2 = ctxt->sax->comment, p_Var2 != (commentSAXFunc)0x0)) &&
                     (ctxt->disableSAX == 0)) {
                    (*p_Var2)(ctxt->userData,val_00);
                  }
                  goto LAB_0015b4d0;
                }
              }
              else if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val)) {
                val_00[local_58] = '\0';
                goto LAB_0015b1f2;
              }
              local_3c = uVar4;
              if (val_01 == 0x2d && uVar4 == 0x2d) {
                xmlFatalErr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,(char *)0x0);
              }
              if (uVar7 <= sVar3 + 5) {
                local_50 = uVar7 * 2;
                buf = (xmlChar *)(*xmlRealloc)(val_00,local_50);
                if (buf == (xmlChar *)0x0) {
                  (*xmlFree)(val_00);
                  xmlErrMemory(ctxt,(char *)0x0);
                  return;
                }
              }
              if (local_5c == 1) {
                buf[sVar3] = (xmlChar)val_01;
                uVar7 = sVar3 + 1;
              }
              else {
                iVar6 = xmlCopyCharMultiByte(buf + sVar3,val_01);
                uVar7 = sVar3 + (long)iVar6;
              }
              local_5c = local_60;
              local_60 = local_64;
              if (local_48 < 0x32) {
                local_48 = local_48 + 1;
              }
              else {
                if (ctxt->progressive == 0) {
                  pxVar1 = ctxt->input;
                  if (((((long)pxVar1->cur - (long)pxVar1->base < 0x1f5) ||
                       (499 < (long)pxVar1->end - (long)pxVar1->cur)) ||
                      (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
                     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                    xmlGROW(ctxt);
                  }
                }
                if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015b4d0;
                local_48 = 0;
              }
              pxVar1 = ctxt->input;
              if (*pxVar1->cur == '\n') {
                pxVar1->line = pxVar1->line + 1;
                pxVar1->col = 1;
              }
              else {
                pxVar1->col = pxVar1->col + 1;
              }
              pxVar1->cur = pxVar1->cur + local_64;
              local_58 = uVar7;
              uVar5 = xmlCurrentChar(ctxt,&local_64);
              if (uVar5 == 0) {
                if (ctxt->progressive == 0) {
                  pxVar1 = ctxt->input;
                  if (((((long)pxVar1->cur - (long)pxVar1->base < 0x1f5) ||
                       (499 < (long)pxVar1->end - (long)pxVar1->cur)) ||
                      (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
                     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                    xmlGROW(ctxt);
                  }
                }
                uVar5 = xmlCurrentChar(ctxt,&local_64);
              }
              val_00 = buf;
              val_01 = local_3c;
              uVar4 = val;
              val = uVar5;
            } while (local_58 <= local_38);
            xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment too big found",
                              (xmlChar *)0x0);
            goto LAB_0015b4d0;
          }
          goto LAB_0015b4b0;
        }
      }
      else if (uVar4 - 0x10000 < 0x100000 || (uVar4 - 0xe000 < 0x1ffe || uVar4 < 0xd800))
      goto LAB_0015b180;
    }
LAB_0015b1f2:
    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"xmlParseComment: invalid xmlChar value %d\n",val);
  }
LAB_0015b4d0:
  (*xmlFree)(buf);
  return;
}

Assistant:

static void
xmlParseCommentComplex(xmlParserCtxtPtr ctxt, xmlChar *buf,
                       size_t len, size_t size) {
    int q, ql;
    int r, rl;
    int cur, l;
    size_t count = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    int inputid;

    inputid = ctxt->input->id;

    if (buf == NULL) {
        len = 0;
	size = XML_PARSER_BUFFER_SIZE;
	buf = (xmlChar *) xmlMallocAtomic(size);
	if (buf == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    return;
	}
    }
    GROW;	/* Assure there's enough input data */
    q = CUR_CHAR(ql);
    if (q == 0)
        goto not_terminated;
    if (!IS_CHAR(q)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	return;
    }
    NEXTL(ql);
    r = CUR_CHAR(rl);
    if (r == 0)
        goto not_terminated;
    if (!IS_CHAR(r)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	return;
    }
    NEXTL(rl);
    cur = CUR_CHAR(l);
    if (cur == 0)
        goto not_terminated;
    while (IS_CHAR(cur) && /* checked */
           ((cur != '>') ||
	    (r != '-') || (q != '-'))) {
	if ((r == '-') && (q == '-')) {
	    xmlFatalErr(ctxt, XML_ERR_HYPHEN_IN_COMMENT, NULL);
	}
	if (len + 5 >= size) {
	    xmlChar *new_buf;
            size_t new_size;

	    new_size = size * 2;
	    new_buf = (xmlChar *) xmlRealloc(buf, new_size);
	    if (new_buf == NULL) {
		xmlFree (buf);
		xmlErrMemory(ctxt, NULL);
		return;
	    }
	    buf = new_buf;
            size = new_size;
	}
	COPY_BUF(ql,buf,len,q);
	q = r;
	ql = rl;
	r = cur;
	rl = l;

	count++;
	if (count > 50) {
	    SHRINK;
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
		xmlFree(buf);
		return;
            }
	}
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    SHRINK;
	    GROW;
	    cur = CUR_CHAR(l);
	}

        if (len > maxLength) {
            xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                         "Comment too big found", NULL);
            xmlFree (buf);
            return;
        }
    }
    buf[len] = 0;
    if (cur == 0) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
	                     "Comment not terminated \n<!--%.50s\n", buf);
    } else if (!IS_CHAR(cur)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  cur);
    } else {
	if (inputid != ctxt->input->id) {
	    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
		           "Comment doesn't start and stop in the same"
                           " entity\n");
	}
        NEXT;
	if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->comment(ctxt->userData, buf);
    }
    xmlFree(buf);
    return;
not_terminated:
    xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
			 "Comment not terminated\n", NULL);
    xmlFree(buf);
    return;
}